

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grafmode.c
# Opt level: O1

_Bool init_graphics_modes(void)

{
  _Bool _Var1;
  parser_error pVar2;
  ang_file *f;
  parser *p;
  parser_state s;
  char buf [1024];
  char line [1024];
  parser_state local_840;
  char local_828 [1024];
  char local_428 [1032];
  
  path_build(local_828,0x400,ANGBAND_DIR_TILES,"list.txt");
  f = file_open(local_828,MODE_READ,FTYPE_TEXT);
  if (f == (ang_file *)0x0) {
    msg("Cannot open \'%s\'.",local_828);
    finish_parse_grafmode((parser *)0x0);
    _Var1 = true;
  }
  else {
    p = parser_new();
    parser_setpriv(p,(void *)0x0);
    parser_reg(p,"name uint index str menuname",parse_graf_name);
    parser_reg(p,"directory sym dirname",parse_graf_directory);
    parser_reg(p,"size uint wid uint hgt str filename",parse_graf_size);
    parser_reg(p,"pref str prefname",parse_graf_pref);
    parser_reg(p,"extra uint alpha uint row uint max",parse_graf_extra);
    do {
      _Var1 = file_getl(f,local_428,0x400);
      if (!_Var1) goto LAB_00157ca6;
      pVar2 = parser_parse(p,local_428);
    } while (pVar2 == PARSE_ERROR_NONE);
    parser_getstate(p,&local_840);
    msg("Parse error in %s line %d column %d: %s: %s",local_828,(ulong)local_840.line,
        (ulong)local_840.col,local_840.msg,parser_error_str[local_840.error]);
    event_signal(EVENT_MESSAGE_FLUSH);
LAB_00157ca6:
    _Var1 = !_Var1;
    finish_parse_grafmode(p);
    file_close(f);
  }
  return _Var1;
}

Assistant:

bool init_graphics_modes(void) {
	char buf[1024];

	ang_file *f;
	struct parser *p;
	errr e = 0;

	int line_no = 0;

	/* Build the filename */
	path_build(buf, sizeof(buf), ANGBAND_DIR_TILES, "list.txt");

	f = file_open(buf, MODE_READ, FTYPE_TEXT);
	if (!f) {
		msg("Cannot open '%s'.", buf);
		finish_parse_grafmode(NULL);
	} else {
		char line[1024];

		p = init_parse_grafmode();
		while (file_getl(f, line, sizeof line)) {
			line_no++;

			e = parser_parse(p, line);
			if (e != PARSE_ERROR_NONE) {
				print_error(buf, p);
				break;
			}
		}

		finish_parse_grafmode(p);
		file_close(f);
	}

	/* Result */
	return e == PARSE_ERROR_NONE;
}